

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  CMUnitTest tests [12];
  CMUnitTest aCStack_1e8 [12];
  
  memcpy(aCStack_1e8,&PTR_anon_var_dwarf_43_00111b60,0x1e0);
  iVar1 = _cmocka_run_group_tests
                    ("tests",aCStack_1e8,0xc,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar1;
}

Assistant:

int main() {
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_art_simple),
        cmocka_unit_test(test_art_erase_all),
        cmocka_unit_test(test_art_is_empty),
        cmocka_unit_test(test_art_iterator_next),
        cmocka_unit_test(test_art_iterator_prev),
        cmocka_unit_test(test_art_iterator_lower_bound),
        cmocka_unit_test(test_art_lower_bound),
        cmocka_unit_test(test_art_upper_bound),
        cmocka_unit_test(test_art_iterator_erase),
        cmocka_unit_test(test_art_iterator_insert),
        cmocka_unit_test(test_art_shadowed),
        cmocka_unit_test(test_art_shrink_grow_node48),
    };
    return cmocka_run_group_tests(tests, NULL, NULL);
}